

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

void __thiscall HighsLpRelaxation::storeDualUBProof(HighsLpRelaxation *this)

{
  bool bVar1;
  HighsSolution *pHVar2;
  long in_RDI;
  bool in_stack_0000014f;
  double *in_stack_00000150;
  vector<double,_std::allocator<double>_> *in_stack_00000158;
  vector<int,_std::allocator<int>_> *in_stack_00000160;
  double in_stack_00000168;
  HighsDomain *in_stack_00000170;
  HighsLpRelaxation *in_stack_00000178;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6081af);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x6081c0);
  pHVar2 = Highs::getSolution((Highs *)(in_RDI + 8));
  if ((pHVar2->dual_valid & 1U) == 0) {
    *(undefined1 *)(in_RDI + 0x5358) = 0;
  }
  else {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6081ec)
    ;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x60820e)
    ;
    bVar1 = computeDualProof(in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000160
                             ,in_stack_00000158,in_stack_00000150,in_stack_0000014f);
    *(bool *)(in_RDI + 0x5358) = bVar1;
  }
  if ((*(byte *)(in_RDI + 0x5358) & 1) == 0) {
    *(undefined8 *)(in_RDI + 0x5350) = 0x7ff0000000000000;
  }
  return;
}

Assistant:

void HighsLpRelaxation::storeDualUBProof() {
  assert(lpsolver.getModelStatus() == HighsModelStatus::kObjectiveBound);

  dualproofinds.clear();
  dualproofvals.clear();

  if (lpsolver.getSolution().dual_valid)
    hasdualproof = computeDualProof(mipsolver.mipdata_->domain,
                                    mipsolver.mipdata_->upper_limit,
                                    dualproofinds, dualproofvals, dualproofrhs);
  else
    hasdualproof = false;

  if (!hasdualproof) dualproofrhs = kHighsInf;
}